

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O1

intptr_t fiobj_data_pos(FIOBJ io)

{
  intptr_t iVar1;
  intptr_t *piVar2;
  
  iVar1 = -1;
  if (((io != 0) && ((~(uint)io & 6) != 0 && (io & 1) == 0)) &&
     (*(char *)(io & 0xfffffffffffffff8) == '+')) {
    piVar2 = (intptr_t *)(io + 0x10);
    if (0xfffffffd < *(uint *)(io + 0x30)) {
      piVar2 = (intptr_t *)(io + 0x28);
    }
    iVar1 = *piVar2;
  }
  return iVar1;
}

Assistant:

intptr_t fiobj_data_pos(FIOBJ io) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA))
    return -1;
  switch (obj2io(io)->fd) {
  case -1: /* fallthrough */
  case -2:
    return obj2io(io)->pos;
    break;
  default:
    return obj2io(io)->source.fpos;
  }
}